

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O0

attr_list libcmudp_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  atom_t aVar1;
  attr_list p_Var2;
  uint16_t uVar3;
  uint32_t __hostlong;
  int iVar4;
  char *pcVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int IP;
  sockaddr_in addr;
  int socket_fd;
  int one;
  uint nl;
  attr_list listen_list;
  u_short port_num;
  int int_port_num;
  udp_transport_data_ptr utd;
  CMtrans_services_conflict in_stack_000001e0;
  void *in_stack_000001e8;
  sockaddr local_5c;
  int local_4c;
  undefined4 local_48;
  socklen_t local_44;
  attr_list local_40;
  uint16_t local_36;
  uint local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  undefined8 local_10;
  
  local_30 = *(long *)(in_RDX + 0x98);
  local_34 = 0;
  local_48 = 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  __hostlong = get_self_ip_addr(in_stack_000001e8,in_stack_000001e0);
  if ((local_28 == 0) || (iVar4 = query_attr(local_28,CM_UDP_PORT,0,&local_34), iVar4 != 0)) {
    if ((0xffff < (int)local_34) || ((int)local_34 < 0)) {
      fprintf(_stderr,"Requested port number %d is invalid\n",(ulong)local_34);
      return (attr_list)0x0;
    }
    (**(code **)(local_18 + 0x30))(local_10,"CMUDP transport connect to port %d",local_34);
  }
  else {
    (**(code **)(local_18 + 0x30))(local_10,"CMUDP transport found no UDP_PORT attribute");
    local_34 = 0;
  }
  local_4c = socket(2,2,0);
  if (local_4c < 0) {
    perror("socket");
    exit(1);
  }
  local_36 = (uint16_t)local_34;
  memset(&local_5c,0,0x10);
  local_5c.sa_family = 2;
  local_5c.sa_data._2_4_ = htonl(0);
  local_5c.sa_data._0_2_ = htons(local_36);
  iVar4 = setsockopt(local_4c,1,0xf,&local_48,4);
  if (iVar4 == -1) {
    perror("setsockopt reuseport");
  }
  iVar4 = bind(local_4c,&local_5c,0x10);
  if (-1 < iVar4) {
    local_44 = 0x10;
    iVar4 = getsockname(local_4c,&local_5c,&local_44);
    if (iVar4 != 0) {
      perror("getsockname");
    }
    local_5c.sa_data._2_4_ = htonl(__hostlong);
    local_40 = (attr_list)create_attr_list();
    add_attr(local_40,CM_UDP_ADDR,1,(long)(int)__hostlong);
    p_Var2 = local_40;
    aVar1 = CM_UDP_PORT;
    uVar3 = ntohs(local_5c.sa_data._0_2_);
    add_attr(p_Var2,aVar1,1,uVar3);
    p_Var2 = local_40;
    aVar1 = CM_TRANSPORT;
    pcVar5 = strdup("udp");
    add_attr(p_Var2,aVar1,3,pcVar5);
    (**(code **)(local_18 + 0x30))
              (local_10,"CMudp Adding libcmudp_data_available as action on fd %d",local_4c);
    (**(code **)(local_18 + 0x18))
              (local_10,local_4c,libcmudp_data_available,local_20,(long)local_4c);
    *(int *)(local_30 + 0x10) = local_4c;
    *(uint32_t *)(local_30 + 0x14) = __hostlong;
    uVar3 = ntohs(local_5c.sa_data._0_2_);
    *(uint *)(local_30 + 0x18) = (uint)uVar3;
    return local_40;
  }
  perror("bind");
  exit(1);
}

Assistant:

extern attr_list
libcmudp_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    udp_transport_data_ptr utd = trans->trans_data;
    int int_port_num = 0;
    u_short port_num;
    attr_list listen_list;
    unsigned int nl;
    int one = 1;
    SOCKET socket_fd;
    struct sockaddr_in addr;
    int IP = get_self_ip_addr(cm, svc);

    if (listen_info != NULL &&
	(!query_attr(listen_info, CM_UDP_PORT, /* type pointer */ NULL,
		     (attr_value *) (intptr_t) &int_port_num))) {
	svc->trace_out(cm, "CMUDP transport found no UDP_PORT attribute");
	int_port_num = 0;
    } else {
	if (int_port_num > USHRT_MAX || int_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", int_port_num);
	    return NULL;
	}
	svc->trace_out(cm, "CMUDP transport connect to port %d", int_port_num);
    }
    if ((socket_fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
	perror("socket");
	exit(1);
    }
    port_num = int_port_num;

    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = htonl(INADDR_ANY);	/* N.B.: differs from *
						 * sender */
    addr.sin_port = htons(port_num);
#ifdef SO_REUSEPORT
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEPORT, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#else
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEADDR, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#endif
    /* bind to receive address */
    if (bind(socket_fd, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
	perror("bind");
	exit(1);
    }
    nl = sizeof(struct sockaddr_in);
    if (getsockname(socket_fd, (struct sockaddr *) &addr, &nl) != 0)
	perror("getsockname");
    

    addr.sin_addr.s_addr = htonl(IP);
    listen_list = create_attr_list();
    add_attr(listen_list, CM_UDP_ADDR, Attr_Int4,
	     (attr_value) (long)IP);
    add_attr(listen_list, CM_UDP_PORT, Attr_Int4,
	     (attr_value) (long) ntohs(addr.sin_port));
    add_attr(listen_list, CM_TRANSPORT, Attr_String,
	     (attr_value) strdup("udp"));
    svc->trace_out(cm, "CMudp Adding libcmudp_data_available as action on fd %d", socket_fd);
    svc->fd_add_select(cm, socket_fd, libcmudp_data_available,
		       (void *) trans, (void *) (intptr_t)socket_fd);
    utd->socket_fd = socket_fd;
    utd->self_ip = IP;
    utd->self_port = ntohs(addr.sin_port);
    return listen_list;
}